

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O3

unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_> __thiscall
draco::StdioFileReader::Open(StdioFileReader *this,string *file_name)

{
  FILE *pFVar1;
  _func_int **pp_Var2;
  
  if ((file_name->_M_string_length != 0) &&
     (pFVar1 = fopen64((file_name->_M_dataplus)._M_p,"rb"), pFVar1 != (FILE *)0x0)) {
    pp_Var2 = (_func_int **)operator_new(0x10,(nothrow_t *)&std::nothrow);
    if (pp_Var2 != (_func_int **)0x0) {
      *pp_Var2 = (_func_int *)&PTR__StdioFileReader_001db7c0;
      pp_Var2[1] = (_func_int *)pFVar1;
      (this->super_FileReaderInterface)._vptr_FileReaderInterface = pp_Var2;
      return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
                )this;
    }
    Open();
    return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
              )this;
  }
  (this->super_FileReaderInterface)._vptr_FileReaderInterface = (_func_int **)0x0;
  return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileReaderInterface> StdioFileReader::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "rb");

  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<FileReaderInterface> file(new (std::nothrow)
                                                StdioFileReader(raw_file_ptr));
  if (file == nullptr) {
    FILEREADER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

  return file;
}